

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int gcm_gen_table(mbedtls_gcm_context *ctx)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint64_t *HiH;
  uint64_t *HiL;
  size_t sStack_60;
  uint32_t T;
  size_t olen;
  uchar h [16];
  uint64_t vh;
  uint64_t vl;
  uint64_t lo;
  uint64_t hi;
  int local_20;
  int j;
  int i;
  int ret;
  mbedtls_gcm_context *ctx_local;
  
  sStack_60 = 0;
  memset(&olen,0,0x10);
  ctx_local._4_4_ =
       mbedtls_cipher_update
                 (&ctx->cipher_ctx,(uchar *)&olen,0x10,(uchar *)&olen,&stack0xffffffffffffffa0);
  if (ctx_local._4_4_ == 0) {
    h._8_8_ = CONCAT44((uint)(byte)olen << 0x18 | (uint)olen._1_1_ << 0x10 | (uint)olen._2_1_ << 8 |
                       (uint)olen._3_1_,
                       (uint)olen._4_1_ << 0x18 | (uint)olen._5_1_ << 0x10 | (uint)olen._6_1_ << 8 |
                       (uint)olen._7_1_);
    vh = CONCAT44((uint)h[0] << 0x18 | (uint)h[1] << 0x10 | (uint)h[2] << 8 | (uint)h[3],
                  (uint)h[4] << 0x18 | (uint)h[5] << 0x10 | (uint)h[6] << 8 | (uint)h[7]);
    ctx->HL[8] = vh;
    ctx->HH[8] = h._8_8_;
    iVar4 = mbedtls_aesni_has_support(2);
    if (iVar4 == 0) {
      ctx->HH[0] = 0;
      ctx->HL[0] = 0;
      for (local_20 = 4; local_20 != 0; local_20 = local_20 >> 1) {
        uVar3 = (uint)vh;
        vh = h._8_8_ << 0x3f | vh >> 1;
        h._8_8_ = (ulong)h._8_8_ >> 1 ^ (ulong)((uVar3 & 1) * -0x1f000000) << 0x20;
        ctx->HL[local_20] = vh;
        ctx->HH[local_20] = h._8_8_;
      }
      for (local_20 = 2; local_20 < 9; local_20 = local_20 << 1) {
        uVar1 = ctx->HH[local_20];
        uVar2 = ctx->HL[local_20];
        for (hi._4_4_ = 1; hi._4_4_ < local_20; hi._4_4_ = hi._4_4_ + 1) {
          (ctx->HH + local_20)[hi._4_4_] = uVar1 ^ ctx->HH[hi._4_4_];
          (ctx->HL + local_20)[hi._4_4_] = uVar2 ^ ctx->HL[hi._4_4_];
        }
      }
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int gcm_gen_table( mbedtls_gcm_context *ctx )
{
    int ret, i, j;
    uint64_t hi, lo;
    uint64_t vl, vh;
    unsigned char h[16];
    size_t olen = 0;

    memset( h, 0, 16 );
    if( ( ret = mbedtls_cipher_update( &ctx->cipher_ctx, h, 16, h, &olen ) ) != 0 )
        return( ret );

    /* pack h as two 64-bits ints, big-endian */
    GET_UINT32_BE( hi, h,  0  );
    GET_UINT32_BE( lo, h,  4  );
    vh = (uint64_t) hi << 32 | lo;

    GET_UINT32_BE( hi, h,  8  );
    GET_UINT32_BE( lo, h,  12 );
    vl = (uint64_t) hi << 32 | lo;

    /* 8 = 1000 corresponds to 1 in GF(2^128) */
    ctx->HL[8] = vl;
    ctx->HH[8] = vh;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    /* With CLMUL support, we need only h, not the rest of the table */
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_CLMUL ) )
        return( 0 );
#endif

    /* 0 corresponds to 0 in GF(2^128) */
    ctx->HH[0] = 0;
    ctx->HL[0] = 0;

    for( i = 4; i > 0; i >>= 1 )
    {
        uint32_t T = ( vl & 1 ) * 0xe1000000U;
        vl  = ( vh << 63 ) | ( vl >> 1 );
        vh  = ( vh >> 1 ) ^ ( (uint64_t) T << 32);

        ctx->HL[i] = vl;
        ctx->HH[i] = vh;
    }

    for( i = 2; i <= 8; i *= 2 )
    {
        uint64_t *HiL = ctx->HL + i, *HiH = ctx->HH + i;
        vh = *HiH;
        vl = *HiL;
        for( j = 1; j < i; j++ )
        {
            HiH[j] = vh ^ ctx->HH[j];
            HiL[j] = vl ^ ctx->HL[j];
        }
    }

    return( 0 );
}